

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O0

Expression * __thiscall
soul::StructuralParser::parseArrayTypeSuffixes
          (StructuralParser *this,Expression *t,ParseTypeContext parseContext)

{
  bool bVar1;
  Expression *t_00;
  TypeMetaFunction *pTVar2;
  Op local_16c;
  char *local_168;
  CompileMessage local_160;
  CompileMessage local_128;
  CompileMessage local_f0;
  CompileMessage local_b8;
  CompileMessage local_70;
  char *local_38;
  char *local_30;
  ParseTypeContext local_24;
  StructuralParser *pSStack_20;
  ParseTypeContext parseContext_local;
  Expression *t_local;
  StructuralParser *this_local;
  
  local_30 = "[";
  local_24 = parseContext;
  pSStack_20 = (StructuralParser *)t;
  t_local = (Expression *)this;
  bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x575e01);
  if (bVar1) {
    t_00 = parseSubscriptWithBrackets(this,(Expression *)pSStack_20);
    this_local = (StructuralParser *)parseArrayTypeSuffixes(this,t_00,local_24);
  }
  else {
    local_38 = "&";
    bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
            ::matches(&this->super_SOULTokeniser,(TokenType)0x573639);
    if (bVar1) {
      switch(local_24) {
      case variableType:
        Errors::typeCannotBeReference<>();
        (*(this->super_SOULTokeniser)._vptr_Tokeniser[2])(this,&local_70);
        CompileMessage::~CompileMessage(&local_70);
        break;
      case nameOrType:
        break;
      default:
        local_168 = (char *)Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                            ::skip(&this->super_SOULTokeniser);
        local_16c = makeReference;
        pTVar2 = allocate<soul::AST::TypeMetaFunction,soul::AST::Context&,soul::AST::Expression&,soul::AST::TypeMetaFunction::Op>
                           (this,(Context *)
                                 &(pSStack_20->super_SOULTokeniser).startLocation.location,
                            (Expression *)pSStack_20,&local_16c);
        return &pTVar2->super_Expression;
      case eventType:
        Errors::eventTypeCannotBeReference<>();
        (*(this->super_SOULTokeniser)._vptr_Tokeniser[2])(this,&local_b8);
        CompileMessage::~CompileMessage(&local_b8);
        break;
      case structMember:
        Errors::memberCannotBeReference<>();
        (*(this->super_SOULTokeniser)._vptr_Tokeniser[2])(this,&local_f0);
        CompileMessage::~CompileMessage(&local_f0);
        break;
      case usingDeclTarget:
        Errors::usingCannotBeReference<>();
        (*(this->super_SOULTokeniser)._vptr_Tokeniser[2])(this,&local_128);
        CompileMessage::~CompileMessage(&local_128);
        break;
      case processorParameter:
        Errors::processorParamsCannotBeReference<>();
        (*(this->super_SOULTokeniser)._vptr_Tokeniser[2])(this,&local_160);
        CompileMessage::~CompileMessage(&local_160);
        break;
      case metaFunctionArgument:
      }
    }
    bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
            ::matches(&this->super_SOULTokeniser,(TokenType)0x548358);
    if (bVar1) {
      this_local = (StructuralParser *)parseDotOperator(this,(Expression *)pSStack_20);
    }
    else {
      this_local = pSStack_20;
    }
  }
  return (Expression *)this_local;
}

Assistant:

AST::Expression& parseArrayTypeSuffixes (AST::Expression& t, ParseTypeContext parseContext)
    {
        if (matchIf (Operator::openBracket))
            return parseArrayTypeSuffixes (parseSubscriptWithBrackets (t), parseContext);

        if (matches (Operator::bitwiseAnd))
        {
            switch (parseContext)
            {
                case ParseTypeContext::variableType:         throwError (Errors::typeCannotBeReference()); break;
                case ParseTypeContext::eventType:            throwError (Errors::eventTypeCannotBeReference()); break;
                case ParseTypeContext::structMember:         throwError (Errors::memberCannotBeReference()); break;
                case ParseTypeContext::usingDeclTarget:      throwError (Errors::usingCannotBeReference()); break;
                case ParseTypeContext::processorParameter:   throwError (Errors::processorParamsCannotBeReference()); break;
                case ParseTypeContext::metaFunctionArgument: break;
                case ParseTypeContext::nameOrType:           break;

                default:
                    skip();
                    return allocate<AST::TypeMetaFunction> (t.context, t, AST::TypeMetaFunction::Op::makeReference);
            }
        }

        if (matches (Operator::dot))
            return parseDotOperator (t);

        return t;
    }